

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_shm_latency.cpp
# Opt level: O2

int main(void)

{
  __pid_t __pid;
  ostream *poVar1;
  int return_status;
  int local_c;
  
  __pid = fork();
  if (__pid < 1) {
    if (__pid == 0) {
      child();
      exit(0);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Can\'t fork!");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    parent();
    waitpid(__pid,&local_c,0);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Each shared memory size = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Message length = ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Number of roundtrips = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,1000000);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Parent process terminated");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
    ::pid_t pid = ::fork();
    if (pid > 0) {
        parent();
        int return_status;
        ::waitpid(pid, &return_status, 0);
    } else if (pid == 0) {
        child();
        ::exit(0);
    } else {
        std::cout << "Can't fork!" << std::endl;
    }
    std::cout << "Each shared memory size = " << shm_size << std::endl;
    std::cout << "Message length = " << sizeof(Message) << std::endl;
    std::cout << "Number of roundtrips = " << times << std::endl;
    std::cout << "Parent process terminated" << std::endl;
    return 0;
}